

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O1

void add_pax_attr_int(archive_string *as,char *key,int64_t value)

{
  bool bVar1;
  size_t value_len;
  ulong uVar2;
  char *pcVar3;
  char *__s;
  char tmp [25];
  char local_22 [10];
  
  local_22[2] = 0;
  uVar2 = -value;
  pcVar3 = local_22 + 1;
  if (0 < value) {
    uVar2 = value;
  }
  do {
    __s = pcVar3;
    *__s = "_abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789"[uVar2 % 10 + 0x35];
    pcVar3 = __s + -1;
    bVar1 = 9 < uVar2;
    uVar2 = uVar2 / 10;
  } while (bVar1);
  if (value < 0) {
    *pcVar3 = '-';
    __s = pcVar3;
  }
  value_len = strlen(__s);
  add_pax_attr_binary(as,key,__s,value_len);
  return;
}

Assistant:

static void
add_pax_attr_int(struct archive_string *as, const char *key, int64_t value)
{
	char tmp[1 + 3 * sizeof(value)];

	tmp[sizeof(tmp) - 1] = 0;
	add_pax_attr(as, key, format_int(tmp + sizeof(tmp) - 1, value));
}